

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O1

InterCode * __thiscall
IrSim::icBinOp(InterCode *__return_storage_ptr__,IrSim *this,int kind,C_OP *t,C_OP *a1,C_OP *a2)

{
  pointer pcVar1;
  undefined1 local_c0 [8];
  _Alloc_hider local_b8;
  char local_a8 [16];
  int local_98;
  undefined1 local_90 [8];
  _Alloc_hider local_88;
  char local_78 [16];
  int local_68;
  undefined1 local_60 [8];
  _Alloc_hider local_58;
  char local_48 [16];
  int local_38;
  
  local_90._0_4_ = t->kind;
  pcVar1 = (t->value)._M_dataplus._M_p;
  local_88._M_p = local_78;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,pcVar1,pcVar1 + (t->value)._M_string_length);
  local_68 = t->active;
  local_c0._0_4_ = a1->kind;
  pcVar1 = (a1->value)._M_dataplus._M_p;
  local_b8._M_p = local_a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b8,pcVar1,pcVar1 + (a1->value)._M_string_length);
  local_98 = a1->active;
  local_60._0_4_ = a2->kind;
  pcVar1 = (a2->value)._M_dataplus._M_p;
  local_58._M_p = local_48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar1,pcVar1 + (a2->value)._M_string_length);
  local_38 = a2->active;
  InterCode::InterCode
            (__return_storage_ptr__,kind,(Operand *)local_90,(Operand *)local_c0,(Operand *)local_60
            );
  if (local_58._M_p != local_48) {
    operator_delete(local_58._M_p);
  }
  if (local_b8._M_p != local_a8) {
    operator_delete(local_b8._M_p);
  }
  if (local_88._M_p != local_78) {
    operator_delete(local_88._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

InterCode icBinOp(int kind, C_OP &t, C_OP &a1, C_OP &a2) const { return InterCode(kind, t, a1, a2); }